

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall node::anon_unknown_2::NodeImpl::baseInitialize(NodeImpl *this)

{
  _Head_base<0UL,_node::Warnings_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  ArgsManager *pAVar4;
  undefined4 extraout_var;
  NodeContext **ppNVar5;
  long in_FS_OFFSET;
  _Head_base<0UL,_node::Warnings_*,_false> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pAVar4 = args(this);
  iVar3 = (*(this->super_Node)._vptr_Node[0x3d])(this);
  local_20._M_head_impl = (Warnings *)CONCAT44(extraout_var,iVar3);
  ppNVar5 = inline_assertion_check<true,node::NodeContext*>
                      ((NodeContext **)&local_20,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                       ,0x6e,"baseInitialize","context()");
  bVar2 = AppInitBasicSetup(pAVar4,&(*ppNVar5)->exit_status);
  if (bVar2) {
    pAVar4 = args(this);
    bVar2 = AppInitParameterInteraction(pAVar4);
    if (bVar2) {
      std::make_unique<node::Warnings>();
      _Var1._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (Warnings *)0x0;
      std::__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>::reset
                ((__uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_> *)
                 &this->m_context->warnings,_Var1._M_head_impl);
      std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::~unique_ptr
                ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)&local_20);
      std::make_unique<kernel::Context>();
      _Var1._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (Warnings *)0x0;
      std::__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>::reset
                ((__uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_> *)
                 this->m_context,(pointer)_Var1._M_head_impl);
      std::unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_>::~unique_ptr
                ((unique_ptr<kernel::Context,_std::default_delete<kernel::Context>_> *)&local_20);
      std::make_unique<ECC_Context>();
      _Var1._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (pointer)0x0;
      std::__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_>::reset
                ((__uniq_ptr_impl<ECC_Context,_std::default_delete<ECC_Context>_> *)
                 &this->m_context->ecc_context,(pointer)_Var1._M_head_impl);
      std::unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_>::~unique_ptr
                ((unique_ptr<ECC_Context,_std::default_delete<ECC_Context>_> *)&local_20);
      bVar2 = AppInitSanityChecks((this->m_context->kernel)._M_t.
                                  super___uniq_ptr_impl<kernel::Context,_std::default_delete<kernel::Context>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_kernel::Context_*,_std::default_delete<kernel::Context>_>
                                  .super__Head_base<0UL,_kernel::Context_*,_false>._M_head_impl);
      if (bVar2) {
        bVar2 = AppInitLockDataDirectory();
        if (bVar2) {
          bVar2 = AppInitInterfaces(this->m_context);
          goto LAB_0079c88d;
        }
      }
    }
  }
  bVar2 = false;
LAB_0079c88d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool baseInitialize() override
    {
        if (!AppInitBasicSetup(args(), Assert(context())->exit_status)) return false;
        if (!AppInitParameterInteraction(args())) return false;

        m_context->warnings = std::make_unique<node::Warnings>();
        m_context->kernel = std::make_unique<kernel::Context>();
        m_context->ecc_context = std::make_unique<ECC_Context>();
        if (!AppInitSanityChecks(*m_context->kernel)) return false;

        if (!AppInitLockDataDirectory()) return false;
        if (!AppInitInterfaces(*m_context)) return false;

        return true;
    }